

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O3

SMaterial * __thiscall irr::scene::CMeshSceneNode::getMaterial(CMeshSceneNode *this,u32 i)

{
  pointer pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  long lVar11;
  undefined1 *puVar12;
  
  if (((this->Mesh != (IMesh *)0x0) && (this->ReadOnlyMaterials == true)) &&
     (uVar8 = (**this->Mesh->_vptr_IMesh)(), i < uVar8)) {
    iVar9 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,(ulong)i);
    lVar10 = (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar9))
                       ((undefined8 *)CONCAT44(extraout_var,iVar9));
    lVar11 = 0;
    do {
      video::SMaterialLayer::operator=
                ((SMaterialLayer *)
                 ((long)&(this->ReadOnlyMaterial).TextureLayers[0].Texture + lVar11),
                 (SMaterialLayer *)(lVar10 + lVar11));
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x80);
    *(undefined2 *)&(this->ReadOnlyMaterial).field_0xb0 = *(undefined2 *)(lVar10 + 0xb0);
    uVar2 = *(undefined8 *)(lVar10 + 0x80);
    uVar3 = *(undefined8 *)(lVar10 + 0x88);
    uVar4 = *(undefined8 *)(lVar10 + 0x90);
    uVar5 = *(undefined8 *)(lVar10 + 0x98);
    uVar6 = *(undefined8 *)(lVar10 + 0xa0);
    uVar7 = *(undefined8 *)(lVar10 + 0xa8);
    (this->ReadOnlyMaterial).ZBuffer = (char)uVar6;
    (this->ReadOnlyMaterial).AntiAliasing = (char)((ulong)uVar6 >> 8);
    *(short *)&(this->ReadOnlyMaterial).field_0xa2 = (short)((ulong)uVar6 >> 0x10);
    (this->ReadOnlyMaterial).BlendFactor = (f32)(int)((ulong)uVar6 >> 0x20);
    (this->ReadOnlyMaterial).PolygonOffsetDepthBias = (f32)(int)uVar7;
    (this->ReadOnlyMaterial).PolygonOffsetSlopeScale = (f32)(int)((ulong)uVar7 >> 0x20);
    (this->ReadOnlyMaterial).SpecularColor = (SColor)(int)uVar4;
    (this->ReadOnlyMaterial).Shininess = (f32)(int)((ulong)uVar4 >> 0x20);
    (this->ReadOnlyMaterial).MaterialTypeParam = (f32)(int)uVar5;
    (this->ReadOnlyMaterial).Thickness = (f32)(int)((ulong)uVar5 >> 0x20);
    (this->ReadOnlyMaterial).MaterialType = (int)uVar2;
    (this->ReadOnlyMaterial).AmbientColor = (SColor)(int)((ulong)uVar2 >> 0x20);
    (this->ReadOnlyMaterial).DiffuseColor = (SColor)(int)uVar3;
    (this->ReadOnlyMaterial).EmissiveColor = (SColor)(int)((ulong)uVar3 >> 0x20);
    return &this->ReadOnlyMaterial;
  }
  pSVar1 = (this->Materials).m_data.
           super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (i < (uint)((int)((ulong)((long)(this->Materials).m_data.
                                     super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 3
                      ) * -0x1642c859)) {
    puVar12 = (undefined1 *)(pSVar1 + i);
  }
  else {
    puVar12 = video::IdentityMaterial;
  }
  return (SMaterial *)puVar12;
}

Assistant:

video::SMaterial &CMeshSceneNode::getMaterial(u32 i)
{
	if (Mesh && ReadOnlyMaterials && i < Mesh->getMeshBufferCount()) {
		ReadOnlyMaterial = Mesh->getMeshBuffer(i)->getMaterial();
		return ReadOnlyMaterial;
	}

	if (i >= Materials.size())
		return ISceneNode::getMaterial(i);

	return Materials[i];
}